

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Form.cpp
# Opt level: O0

void __thiscall curlpp::HttpPost::HttpPost(HttpPost *this,Forms *posts)

{
  bool bVar1;
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_RDI;
  const_iterator pos;
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  *in_stack_ffffffffffffff98;
  FormPart *in_stack_ffffffffffffffa0;
  size_t *__x;
  _Self local_28;
  _List_node_base *local_20;
  _List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> local_18 [3];
  
  (in_RDI->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (in_RDI->
  super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  std::__cxx11::
  list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
  ::list((list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
          *)0x14baa5);
  std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::_List_const_iterator(local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::
             list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
             ::begin(in_stack_ffffffffffffff98);
  local_18[0]._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_18,&local_28);
    if (!bVar1) break;
    __x = &(in_RDI->
           super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
           )._M_impl._M_node._M_size;
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator*
              ((_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_> *)
               in_stack_ffffffffffffffa0);
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::push_back(in_RDI,(value_type *)__x);
    std::__cxx11::
    list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
    ::back((list<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
            *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 =
         utilspp::clone_ptr<curlpp::FormPart>::operator->((clone_ptr<curlpp::FormPart> *)in_RDI);
    (*in_stack_ffffffffffffffa0->_vptr_FormPart[3])
              (in_stack_ffffffffffffffa0,in_RDI,
               &(in_RDI->
                super__List_base<utilspp::clone_ptr<curlpp::FormPart>,_std::allocator<utilspp::clone_ptr<curlpp::FormPart>_>_>
                )._M_impl._M_node.super__List_node_base._M_prev);
    std::_List_const_iterator<utilspp::clone_ptr<curlpp::FormPart>_>::operator++(local_18,0);
  }
  return;
}

Assistant:

curlpp::HttpPost::HttpPost(const Forms & posts)
  : mFirst(NULL)
  , mLast(NULL)
{
  Forms::const_iterator pos;
  for(pos = posts.begin(); pos != posts.end(); pos++) 
  {
    mForms.push_back(*pos);
    mForms.back()->add(&mFirst, &mLast);
  } 
}